

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

void __thiscall
cmSourceFileLocation::cmSourceFileLocation(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  cmSourceFileLocation *loc_local;
  cmSourceFileLocation *this_local;
  
  this->Makefile = loc->Makefile;
  std::__cxx11::string::string((string *)&this->Directory);
  std::__cxx11::string::string((string *)&this->Name);
  this->AmbiguousDirectory = (bool)(loc->AmbiguousDirectory & 1);
  this->AmbiguousExtension = (bool)(loc->AmbiguousExtension & 1);
  std::__cxx11::string::operator=((string *)&this->Directory,(string *)&loc->Directory);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)&loc->Name);
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation(const cmSourceFileLocation& loc)
  : Makefile(loc.Makefile)
{
  this->AmbiguousDirectory = loc.AmbiguousDirectory;
  this->AmbiguousExtension = loc.AmbiguousExtension;
  this->Directory = loc.Directory;
  this->Name = loc.Name;
}